

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QPixmap * QPixmapStylePrivate::scale(int w,int h,QPixmap *pixmap,QPixmapStyleDescriptor *desc)

{
  int in_EDX;
  int in_ESI;
  QPixmap *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  QPixmap *result;
  QMargins margins;
  QPainter p;
  QColor transparent;
  QMargins *in_stack_00000298;
  QRect *in_stack_000002a0;
  QPixmap *in_stack_000002a8;
  QMargins *in_stack_000002b0;
  QRect *in_stack_000002b8;
  QPainter *in_stack_000002c0;
  QFlagsStorage<QDrawBorderPixmap::DrawingHint> in_stack_0000035c;
  QTileRules *in_stack_00000f20;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar1;
  undefined1 local_54 [4];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap(in_RDI,in_ESI,in_EDX);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor((QColor *)CONCAT17(uVar1,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
  QPixmap::fill((QColor *)in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_20,(QPaintDevice *)in_RDI);
  local_30 = *(undefined8 *)(in_R8 + 0x20);
  local_28 = *(undefined8 *)(in_R8 + 0x28);
  local_40 = QPixmap::rect();
  local_50 = QPixmap::rect();
  memset(local_54,0,4);
  QFlags<QDrawBorderPixmap::DrawingHint>::QFlags((QFlags<QDrawBorderPixmap::DrawingHint> *)0x403755)
  ;
  qDrawBorderPixmap(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
                    in_stack_000002a0,in_stack_00000298,in_stack_00000f20,
                    (DrawingHints)in_stack_0000035c.i);
  QPainter::~QPainter((QPainter *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPixmap QPixmapStylePrivate::scale(int w, int h, const QPixmap &pixmap, const QPixmapStyleDescriptor &desc)
{
    QPixmap result(w, h);
    {
        const QColor transparent(0, 0, 0, 0);
        result.fill( transparent );
        QPainter p( &result );
        const QMargins margins = desc.margins;
        qDrawBorderPixmap(&p, result.rect(), margins, pixmap,
                          pixmap.rect(), margins, desc.tileRules);
    }
    return result;
}